

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParserTests.cpp
# Opt level: O1

void __thiscall
ParserTest_InvalidFunctionDeclarationThrows_Test::TestBody
          (ParserTest_InvalidFunctionDeclarationThrows_Test *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  string local_1a8;
  function<std::unique_ptr<Node,_std::default_delete<Node>_>_(Parser_*)> local_188;
  function<std::unique_ptr<Node,_std::default_delete<Node>_>_(Parser_*)> local_168;
  function<std::unique_ptr<Node,_std::default_delete<Node>_>_(Parser_*)> local_148;
  function<std::unique_ptr<Node,_std::default_delete<Node>_>_(Parser_*)> local_128;
  function<std::unique_ptr<Node,_std::default_delete<Node>_>_(Parser_*)> local_108;
  function<std::unique_ptr<Node,_std::default_delete<Node>_>_(Parser_*)> local_e8;
  function<std::unique_ptr<Node,_std::default_delete<Node>_>_(Parser_*)> local_c8;
  function<std::unique_ptr<Node,_std::default_delete<Node>_>_(Parser_*)> local_a8;
  function<std::unique_ptr<Node,_std::default_delete<Node>_>_(Parser_*)> local_88;
  function<std::unique_ptr<Node,_std::default_delete<Node>_>_(Parser_*)> local_68;
  function<std::unique_ptr<Node,_std::default_delete<Node>_>_(Parser_*)> local_48;
  
  paVar1 = &local_1a8.field_2;
  local_1a8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a8,"t(x: f32): f32 { }","");
  local_48.super__Function_base._M_functor._M_unused._M_object = Parser::parseFunctionDeclaration;
  local_48.super__Function_base._M_functor._8_8_ = 0;
  local_48._M_invoker =
       std::
       _Function_handler<std::unique_ptr<Node,_std::default_delete<Node>_>_(Parser_*),_std::unique_ptr<FunctionDeclarationNode,_std::default_delete<FunctionDeclarationNode>_>_(Parser::*)()>
       ::_M_invoke;
  local_48.super__Function_base._M_manager =
       std::
       _Function_handler<std::unique_ptr<Node,_std::default_delete<Node>_>_(Parser_*),_std::unique_ptr<FunctionDeclarationNode,_std::default_delete<FunctionDeclarationNode>_>_(Parser::*)()>
       ::_M_manager;
  testThrow(&local_1a8,&local_48);
  if (local_48.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_48.super__Function_base._M_manager)
              ((_Any_data *)&local_48,(_Any_data *)&local_48,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8._M_dataplus._M_p != paVar1) {
    operator_delete(local_1a8._M_dataplus._M_p,local_1a8.field_2._M_allocated_capacity + 1);
  }
  local_1a8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a8,"fn (x:f32): f32 {}","");
  local_68.super__Function_base._M_functor._M_unused._M_object = Parser::parseFunctionDeclaration;
  local_68.super__Function_base._M_functor._8_8_ = 0;
  local_68._M_invoker =
       std::
       _Function_handler<std::unique_ptr<Node,_std::default_delete<Node>_>_(Parser_*),_std::unique_ptr<FunctionDeclarationNode,_std::default_delete<FunctionDeclarationNode>_>_(Parser::*)()>
       ::_M_invoke;
  local_68.super__Function_base._M_manager =
       std::
       _Function_handler<std::unique_ptr<Node,_std::default_delete<Node>_>_(Parser_*),_std::unique_ptr<FunctionDeclarationNode,_std::default_delete<FunctionDeclarationNode>_>_(Parser::*)()>
       ::_M_manager;
  testThrow(&local_1a8,&local_68);
  if (local_68.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_68.super__Function_base._M_manager)
              ((_Any_data *)&local_68,(_Any_data *)&local_68,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8._M_dataplus._M_p != paVar1) {
    operator_delete(local_1a8._M_dataplus._M_p,local_1a8.field_2._M_allocated_capacity + 1);
  }
  local_1a8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a8,"fn t :f32): f32 {}","");
  local_88.super__Function_base._M_functor._M_unused._M_object = Parser::parseFunctionDeclaration;
  local_88.super__Function_base._M_functor._8_8_ = 0;
  local_88._M_invoker =
       std::
       _Function_handler<std::unique_ptr<Node,_std::default_delete<Node>_>_(Parser_*),_std::unique_ptr<FunctionDeclarationNode,_std::default_delete<FunctionDeclarationNode>_>_(Parser::*)()>
       ::_M_invoke;
  local_88.super__Function_base._M_manager =
       std::
       _Function_handler<std::unique_ptr<Node,_std::default_delete<Node>_>_(Parser_*),_std::unique_ptr<FunctionDeclarationNode,_std::default_delete<FunctionDeclarationNode>_>_(Parser::*)()>
       ::_M_manager;
  testThrow(&local_1a8,&local_88);
  if (local_88.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_88.super__Function_base._M_manager)
              ((_Any_data *)&local_88,(_Any_data *)&local_88,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8._M_dataplus._M_p != paVar1) {
    operator_delete(local_1a8._M_dataplus._M_p,local_1a8.field_2._M_allocated_capacity + 1);
  }
  local_1a8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a8,"fn t(x f32) :f32 {}","");
  local_a8.super__Function_base._M_functor._M_unused._M_object = Parser::parseFunctionDeclaration;
  local_a8.super__Function_base._M_functor._8_8_ = 0;
  local_a8._M_invoker =
       std::
       _Function_handler<std::unique_ptr<Node,_std::default_delete<Node>_>_(Parser_*),_std::unique_ptr<FunctionDeclarationNode,_std::default_delete<FunctionDeclarationNode>_>_(Parser::*)()>
       ::_M_invoke;
  local_a8.super__Function_base._M_manager =
       std::
       _Function_handler<std::unique_ptr<Node,_std::default_delete<Node>_>_(Parser_*),_std::unique_ptr<FunctionDeclarationNode,_std::default_delete<FunctionDeclarationNode>_>_(Parser::*)()>
       ::_M_manager;
  testThrow(&local_1a8,&local_a8);
  if (local_a8.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_a8.super__Function_base._M_manager)
              ((_Any_data *)&local_a8,(_Any_data *)&local_a8,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8._M_dataplus._M_p != paVar1) {
    operator_delete(local_1a8._M_dataplus._M_p,local_1a8.field_2._M_allocated_capacity + 1);
  }
  local_1a8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a8,"fn f(x: f32) f32 {}","");
  local_c8.super__Function_base._M_functor._M_unused._M_object = Parser::parseFunctionDeclaration;
  local_c8.super__Function_base._M_functor._8_8_ = 0;
  local_c8._M_invoker =
       std::
       _Function_handler<std::unique_ptr<Node,_std::default_delete<Node>_>_(Parser_*),_std::unique_ptr<FunctionDeclarationNode,_std::default_delete<FunctionDeclarationNode>_>_(Parser::*)()>
       ::_M_invoke;
  local_c8.super__Function_base._M_manager =
       std::
       _Function_handler<std::unique_ptr<Node,_std::default_delete<Node>_>_(Parser_*),_std::unique_ptr<FunctionDeclarationNode,_std::default_delete<FunctionDeclarationNode>_>_(Parser::*)()>
       ::_M_manager;
  testThrow(&local_1a8,&local_c8);
  if (local_c8.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_c8.super__Function_base._M_manager)
              ((_Any_data *)&local_c8,(_Any_data *)&local_c8,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8._M_dataplus._M_p != paVar1) {
    operator_delete(local_1a8._M_dataplus._M_p,local_1a8.field_2._M_allocated_capacity + 1);
  }
  local_1a8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a8,"fn f(x: f32) : {}","");
  local_e8.super__Function_base._M_functor._M_unused._M_object = Parser::parseFunctionDeclaration;
  local_e8.super__Function_base._M_functor._8_8_ = 0;
  local_e8._M_invoker =
       std::
       _Function_handler<std::unique_ptr<Node,_std::default_delete<Node>_>_(Parser_*),_std::unique_ptr<FunctionDeclarationNode,_std::default_delete<FunctionDeclarationNode>_>_(Parser::*)()>
       ::_M_invoke;
  local_e8.super__Function_base._M_manager =
       std::
       _Function_handler<std::unique_ptr<Node,_std::default_delete<Node>_>_(Parser_*),_std::unique_ptr<FunctionDeclarationNode,_std::default_delete<FunctionDeclarationNode>_>_(Parser::*)()>
       ::_M_manager;
  testThrow(&local_1a8,&local_e8);
  if (local_e8.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_e8.super__Function_base._M_manager)
              ((_Any_data *)&local_e8,(_Any_data *)&local_e8,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8._M_dataplus._M_p != paVar1) {
    operator_delete(local_1a8._M_dataplus._M_p,local_1a8.field_2._M_allocated_capacity + 1);
  }
  local_1a8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a8,"fn f(x: f32, ): f32 {}","");
  local_108.super__Function_base._M_functor._M_unused._M_object = Parser::parseFunctionDeclaration;
  local_108.super__Function_base._M_functor._8_8_ = 0;
  local_108._M_invoker =
       std::
       _Function_handler<std::unique_ptr<Node,_std::default_delete<Node>_>_(Parser_*),_std::unique_ptr<FunctionDeclarationNode,_std::default_delete<FunctionDeclarationNode>_>_(Parser::*)()>
       ::_M_invoke;
  local_108.super__Function_base._M_manager =
       std::
       _Function_handler<std::unique_ptr<Node,_std::default_delete<Node>_>_(Parser_*),_std::unique_ptr<FunctionDeclarationNode,_std::default_delete<FunctionDeclarationNode>_>_(Parser::*)()>
       ::_M_manager;
  testThrow(&local_1a8,&local_108);
  if (local_108.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_108.super__Function_base._M_manager)
              ((_Any_data *)&local_108,(_Any_data *)&local_108,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8._M_dataplus._M_p != paVar1) {
    operator_delete(local_1a8._M_dataplus._M_p,local_1a8.field_2._M_allocated_capacity + 1);
  }
  local_1a8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_1a8,"fn f(x: f32, y) : f32 {}","");
  local_128.super__Function_base._M_functor._M_unused._M_object = Parser::parseFunctionDeclaration;
  local_128.super__Function_base._M_functor._8_8_ = 0;
  local_128._M_invoker =
       std::
       _Function_handler<std::unique_ptr<Node,_std::default_delete<Node>_>_(Parser_*),_std::unique_ptr<FunctionDeclarationNode,_std::default_delete<FunctionDeclarationNode>_>_(Parser::*)()>
       ::_M_invoke;
  local_128.super__Function_base._M_manager =
       std::
       _Function_handler<std::unique_ptr<Node,_std::default_delete<Node>_>_(Parser_*),_std::unique_ptr<FunctionDeclarationNode,_std::default_delete<FunctionDeclarationNode>_>_(Parser::*)()>
       ::_M_manager;
  testThrow(&local_1a8,&local_128);
  if (local_128.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_128.super__Function_base._M_manager)
              ((_Any_data *)&local_128,(_Any_data *)&local_128,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8._M_dataplus._M_p != paVar1) {
    operator_delete(local_1a8._M_dataplus._M_p,local_1a8.field_2._M_allocated_capacity + 1);
  }
  local_1a8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a8,"fn f(x: f32) : f32","");
  local_148.super__Function_base._M_functor._M_unused._M_object = Parser::parseFunctionDeclaration;
  local_148.super__Function_base._M_functor._8_8_ = 0;
  local_148._M_invoker =
       std::
       _Function_handler<std::unique_ptr<Node,_std::default_delete<Node>_>_(Parser_*),_std::unique_ptr<FunctionDeclarationNode,_std::default_delete<FunctionDeclarationNode>_>_(Parser::*)()>
       ::_M_invoke;
  local_148.super__Function_base._M_manager =
       std::
       _Function_handler<std::unique_ptr<Node,_std::default_delete<Node>_>_(Parser_*),_std::unique_ptr<FunctionDeclarationNode,_std::default_delete<FunctionDeclarationNode>_>_(Parser::*)()>
       ::_M_manager;
  testThrow(&local_1a8,&local_148);
  if (local_148.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_148.super__Function_base._M_manager)
              ((_Any_data *)&local_148,(_Any_data *)&local_148,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8._M_dataplus._M_p != paVar1) {
    operator_delete(local_1a8._M_dataplus._M_p,local_1a8.field_2._M_allocated_capacity + 1);
  }
  local_1a8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a8,"fn f(x: f32) : f32 {","");
  local_168.super__Function_base._M_functor._M_unused._M_object = Parser::parseFunctionDeclaration;
  local_168.super__Function_base._M_functor._8_8_ = 0;
  local_168._M_invoker =
       std::
       _Function_handler<std::unique_ptr<Node,_std::default_delete<Node>_>_(Parser_*),_std::unique_ptr<FunctionDeclarationNode,_std::default_delete<FunctionDeclarationNode>_>_(Parser::*)()>
       ::_M_invoke;
  local_168.super__Function_base._M_manager =
       std::
       _Function_handler<std::unique_ptr<Node,_std::default_delete<Node>_>_(Parser_*),_std::unique_ptr<FunctionDeclarationNode,_std::default_delete<FunctionDeclarationNode>_>_(Parser::*)()>
       ::_M_manager;
  testThrow(&local_1a8,&local_168);
  if (local_168.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_168.super__Function_base._M_manager)
              ((_Any_data *)&local_168,(_Any_data *)&local_168,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8._M_dataplus._M_p != paVar1) {
    operator_delete(local_1a8._M_dataplus._M_p,local_1a8.field_2._M_allocated_capacity + 1);
  }
  local_1a8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a8,"fn f(x: f32) : f32 }","");
  local_188.super__Function_base._M_functor._M_unused._M_object = Parser::parseFunctionDeclaration;
  local_188.super__Function_base._M_functor._8_8_ = 0;
  local_188._M_invoker =
       std::
       _Function_handler<std::unique_ptr<Node,_std::default_delete<Node>_>_(Parser_*),_std::unique_ptr<FunctionDeclarationNode,_std::default_delete<FunctionDeclarationNode>_>_(Parser::*)()>
       ::_M_invoke;
  local_188.super__Function_base._M_manager =
       std::
       _Function_handler<std::unique_ptr<Node,_std::default_delete<Node>_>_(Parser_*),_std::unique_ptr<FunctionDeclarationNode,_std::default_delete<FunctionDeclarationNode>_>_(Parser::*)()>
       ::_M_manager;
  testThrow(&local_1a8,&local_188);
  if (local_188.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_188.super__Function_base._M_manager)
              ((_Any_data *)&local_188,(_Any_data *)&local_188,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8._M_dataplus._M_p != paVar1) {
    operator_delete(local_1a8._M_dataplus._M_p,local_1a8.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

TEST(ParserTest, BinaryExpr)
{
  auto node = std::make_unique<BinaryOpNode>(
      std::make_unique<NumericLiteralNode>(2), 
      BinaryOperator::BinaryAnd, 
      std::make_unique<NumericLiteralNode>(3));
  setupTest("2 & 3", &Parser::parseArithmeticExpression, std::move(node));

  node = std::make_unique<BinaryOpNode>(
      std::make_unique<NumericLiteralNode>(5), 
      BinaryOperator::BinaryOr, 
      std::make_unique<NumericLiteralNode>(3));
  setupTest("5 | 3", &Parser::parseArithmeticExpression, std::move(node));

  node = std::make_unique<BinaryOpNode>(
      std::make_unique<VariableNode>("x"), 
      BinaryOperator::BinaryXor, 
      std::make_unique<NumericLiteralNode>(2));
  setupTest("x ^ 2", &Parser::parseArithmeticExpression, std::move(node));

  node = std::make_unique<BinaryOpNode>(
      std::make_unique<NumericLiteralNode>(1), 
      BinaryOperator::ShiftLeft, 
      std::make_unique<NumericLiteralNode>(2));
  setupTest("1 << 2", &Parser::parseArithmeticExpression, std::move(node));

  node = std::make_unique<BinaryOpNode>(
      std::make_unique<NumericLiteralNode>(1), 
      BinaryOperator::ShiftRight, 
      std::make_unique<NumericLiteralNode>(2));
  setupTest("1 >> 2", &Parser::parseArithmeticExpression, std::move(node));
}